

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86.cpp
# Opt level: O3

int __thiscall ncnn::Convolution_x86::create_pipeline_int8_x86(Convolution_x86 *this,Option *opt)

{
  _func_int **pp_Var1;
  _func_int *p_Var2;
  ulong uVar3;
  int iVar4;
  
  pp_Var1 = this->_vptr_Convolution_x86;
  p_Var2 = pp_Var1[-3];
  uVar3 = (long)*(int *)(p_Var2 + 0x2c + (long)&(this->weight_3x3_winograd23_data_int8).data) /
          (long)(*(int *)(p_Var2 + (long)&(this->weight_3x3_winograd23_data_int8).data) *
                *(int *)(&this->field_0xbc + (long)p_Var2));
  iVar4 = *(int *)(&this->use_winograd3x3_int8 + (long)p_Var2);
  this->use_winograd3x3_int8 = false;
  if ((((((opt->use_winograd_convolution == true) &&
         (p_Var2 = pp_Var1[-3], *(int *)(&this->field_0xbc + (long)p_Var2) == 3)) &&
        (*(int *)(p_Var2 + (long)&(this->weight_3x3_winograd23_data_int8).data) == 3)) &&
       ((*(int *)(p_Var2 + 4 + (long)&(this->weight_3x3_winograd23_data_int8).data) == 1 &&
        (*(int *)(p_Var2 + 8 + (long)&(this->weight_3x3_winograd23_data_int8).data) == 1)))) &&
      ((*(int *)(p_Var2 + 0xc + (long)&(this->weight_3x3_winograd23_data_int8).data) == 1 &&
       ((*(int *)(p_Var2 + 0x10 + (long)&(this->weight_3x3_winograd23_data_int8).data) == 1 &&
        (iVar4 = (int)((long)((ulong)(uint)((int)uVar3 >> 0x1f) << 0x20 | uVar3 & 0xffffffff) /
                      (long)iVar4), 0xf < iVar4)))))) &&
     (0xf < *(int *)(&this->use_winograd3x3_int8 + (long)p_Var2))) {
    this->use_winograd3x3_int8 = true;
    conv3x3s1_winograd23_transform_kernel_int8_sse
              ((Mat *)(&this->field_0x138 + (long)pp_Var1[-3]),
               &this->weight_3x3_winograd23_data_int8,iVar4,
               *(int *)(&this->use_winograd3x3_int8 + (long)pp_Var1[-3]));
  }
  return 0;
}

Assistant:

int Convolution_x86::create_pipeline_int8_x86(const Option& opt)
{
    int kernel_size = kernel_w * kernel_h;
    int num_input = weight_data_size / kernel_size / num_output;

    use_winograd3x3_int8 = false;

    if (opt.use_winograd_convolution && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1
        && num_input >= 16 && num_output >= 16)
    {
        // winograd is slow on small channel count
        use_winograd3x3_int8 = true;

        conv3x3s1_winograd23_transform_kernel_int8_sse(weight_data, weight_3x3_winograd23_data_int8, num_input, num_output);
//         conv3x3s1_winograd43_transform_kernel_int8_sse(weight_data, weight_3x3_winograd23_data_int8, num_input, num_output);
    }
    else
    {
        // TODO offline transform weight
    }

    return 0;
}